

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalGhsMultiGenerator::AddCheckTarget(cmGlobalGhsMultiGenerator *this)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_01;
  char *__s;
  pointer this_00;
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  uint uVar3;
  const_reference item;
  string *psVar4;
  pointer this_01;
  cmMakefile *this_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *r;
  cmake *pcVar5;
  iterator iVar6;
  iterator iVar7;
  cmLocalGhsMultiGenerator *pcVar8;
  pointer pcVar9;
  cmSourceFile *this_03;
  string local_6f8;
  allocator<char> local_6d1;
  string local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_690;
  cmSourceFile *local_688;
  cmSourceFile *file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_668;
  string local_650;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_630;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> local_628;
  pointer local_620;
  cmGeneratorTarget *gt;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> local_610;
  __single_object ptr;
  allocator<char> local_5f9;
  string local_5f8;
  cmLocalGhsMultiGenerator *local_5d8;
  cmTarget *tgt;
  __single_object cc;
  basic_string_view<char,_std::char_traits<char>_> local_5b8;
  basic_string_view<char,_std::char_traits<char>_> local_5a8;
  undefined1 local_598 [16];
  iterator local_588;
  undefined8 local_580;
  cmCustomCommandLine local_578;
  basic_string_view<char,_std::char_traits<char>_> local_560;
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  iterator local_530;
  undefined8 local_528;
  cmCustomCommandLine local_520;
  cmAlphaNum local_508;
  cmAlphaNum local_4d8;
  undefined1 local_4a8 [8];
  string argB;
  cmAlphaNum local_458;
  undefined1 local_428 [8];
  string argS;
  basic_string_view<char,_std::char_traits<char>_> local_3f8;
  basic_string_view<char,_std::char_traits<char>_> local_3e8;
  basic_string_view<char,_std::char_traits<char>_> local_3d8;
  undefined1 local_3c8 [16];
  iterator local_3b8;
  undefined8 local_3b0;
  cmCustomCommandLine local_3a8;
  undefined1 local_390 [8];
  cmCustomCommandLines commandLines;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_370;
  const_iterator local_368;
  const_iterator local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_358;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_350;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_348;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  newEnd;
  cmListFileBacktrace local_328;
  string local_318;
  undefined1 local_2f8 [8];
  ostringstream msg;
  cmAlphaNum local_180;
  cmAlphaNum local_150;
  string local_120;
  reference local_100;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *gen;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  listFiles;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  cmGeneratorTarget *local_60;
  cmLocalGhsMultiGenerator *lg;
  vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
  *generators;
  allocator<char> local_39;
  string local_38;
  cmGlobalGhsMultiGenerator *local_18;
  cmGlobalGhsMultiGenerator *this_local;
  
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_SUPPRESS_REGENERATION",&local_39);
  bVar2 = cmGlobalGenerator::GlobalSettingIsOn(&this->super_cmGlobalGenerator,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if (bVar2) {
    this_local._7_1_ = false;
  }
  else {
    lg = (cmLocalGhsMultiGenerator *)&(this->super_cmGlobalGenerator).LocalGenerators;
    item = std::
           vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ::operator[]((vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                         *)lg,0);
    local_60 = (cmGeneratorTarget *)
               ::cm::
               static_reference_cast<cmLocalGhsMultiGenerator,_const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_0>
                         (item);
    psVar4 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)local_60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"/CMakeFiles/",
               (allocator<char> *)
               ((long)&listFiles.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::operator+(&local_a0,psVar4,&local_c0);
    std::operator+(&local_80,&local_a0,CHECK_BUILD_SYSTEM_TARGET);
    std::__cxx11::string::operator=((string *)&this->StampFile,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&listFiles.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1);
    pcVar8 = lg;
    __end1 = std::
             vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ::begin((vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                      *)lg);
    gen = (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
          std::
          vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
          ::end((vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                 *)pcVar8);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                                       *)&gen), bVar2) {
      local_100 = __gnu_cxx::
                  __normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                  ::operator*(&__end1);
      this_01 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                operator->(local_100);
      this_02 = cmLocalGenerator::GetMakefile(this_01);
      r = cmMakefile::GetListFiles_abi_cxx11_(this_02);
      ::cm::
      append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1,r);
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
      ::operator++(&__end1);
    }
    pcVar5 = cmGlobalGenerator::GetCMakeInstance(&this->super_cmGlobalGenerator);
    psVar4 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar5);
    cmAlphaNum::cmAlphaNum(&local_150,psVar4);
    cmAlphaNum::cmAlphaNum(&local_180,"/CMakeCache.txt");
    cmStrCat<>(&local_120,&local_150,&local_180);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    pcVar5 = cmGlobalGenerator::GetCMakeInstance(&this->super_cmGlobalGenerator);
    bVar2 = cmake::DoWriteGlobVerifyTarget(pcVar5);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
      std::operator<<((ostream *)local_2f8,
                      "Any pre-check scripts, such as those generated for file(GLOB CONFIGURE_DEPENDS), will not be run by gbuild."
                     );
      pcVar5 = cmGlobalGenerator::GetCMakeInstance(&this->super_cmGlobalGenerator);
      std::__cxx11::ostringstream::str();
      local_328.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_328.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmListFileBacktrace::cmListFileBacktrace(&local_328);
      cmake::IssueMessage(pcVar5,AUTHOR_WARNING,&local_318,&local_328);
      cmListFileBacktrace::~cmListFileBacktrace(&local_328);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
    }
    iVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range1);
    iVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range1);
    std::
    sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
              (iVar6._M_current,iVar7._M_current);
    local_350._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1);
    local_358 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range1);
    local_348 = std::
                unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          (local_350,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_358);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_360,&local_348);
    local_370._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_368,&local_370);
    commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&__range1,local_360,local_368);
    cmCustomCommandLines::cmCustomCommandLines((cmCustomCommandLines *)local_390);
    psVar4 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    argS.field_2._8_8_ = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3f8,"-E");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3e8,"rm");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3d8,"-f");
    local_3c8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->StampFile)
    ;
    local_3b8 = (iterator)((long)&argS.field_2 + 8);
    local_3b0 = 5;
    ilist_01._M_len = 5;
    ilist_01._M_array = local_3b8;
    cmMakeCommandLine(&local_3a8,ilist_01);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
    emplace_back<cmCustomCommandLine>
              ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)local_390,
               &local_3a8);
    cmCustomCommandLine::~cmCustomCommandLine(&local_3a8);
    cmAlphaNum::cmAlphaNum(&local_458,"-S");
    psVar4 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_((cmLocalGenerator *)local_60);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&argB.field_2 + 8),psVar4);
    cmStrCat<>((string *)local_428,&local_458,(cmAlphaNum *)((long)&argB.field_2 + 8));
    cmAlphaNum::cmAlphaNum(&local_4d8,"-B");
    psVar4 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)local_60);
    cmAlphaNum::cmAlphaNum(&local_508,psVar4);
    cmStrCat<>((string *)local_4a8,&local_4d8,&local_508);
    psVar4 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    local_560 = (basic_string_view<char,_std::char_traits<char>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
    local_550 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_428);
    local_540 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_4a8);
    local_530 = &local_560;
    local_528 = 3;
    ilist_00._M_len = 3;
    ilist_00._M_array = local_530;
    cmMakeCommandLine(&local_520,ilist_00);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
    emplace_back<cmCustomCommandLine>
              ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)local_390,
               &local_520);
    cmCustomCommandLine::~cmCustomCommandLine(&local_520);
    psVar4 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
    super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
         std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_5b8,"-E");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_5a8,"touch");
    local_598 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->StampFile)
    ;
    local_588 = (iterator)&cc;
    local_580 = 4;
    ilist._M_len = 4;
    ilist._M_array = local_588;
    cmMakeCommandLine(&local_578,ilist);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
    emplace_back<cmCustomCommandLine>
              ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)local_390,
               &local_578);
    cmCustomCommandLine::~cmCustomCommandLine(&local_578);
    std::make_unique<cmCustomCommand>();
    pcVar1 = local_60;
    __s = CHECK_BUILD_SYSTEM_TARGET;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5f8,__s,&local_5f9);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&ptr,
               (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&tgt);
    pcVar8 = (cmLocalGhsMultiGenerator *)
             cmLocalGenerator::AddUtilityCommand
                       ((cmLocalGenerator *)pcVar1,&local_5f8,true,
                        (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&ptr);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&ptr);
    std::__cxx11::string::~string((string *)&local_5f8);
    std::allocator<char>::~allocator(&local_5f9);
    gt = local_60;
    local_5d8 = pcVar8;
    std::make_unique<cmGeneratorTarget,cmTarget*&,cmLocalGhsMultiGenerator*>
              ((cmTarget **)&local_610,&local_5d8);
    local_620 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::get
                          (&local_610);
    pcVar1 = local_60;
    std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::unique_ptr
              (&local_628,&local_610);
    cmLocalGenerator::AddGeneratorTarget((cmLocalGenerator *)pcVar1,&local_628);
    std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
              (&local_628);
    std::make_unique<cmCustomCommand>();
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator=
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&tgt,&local_630
              );
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_630)
    ;
    pcVar9 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                       ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&tgt);
    std::__cxx11::string::string((string *)&local_650,(string *)&this->StampFile);
    cmCustomCommand::SetOutputs(pcVar9,&local_650);
    std::__cxx11::string::~string((string *)&local_650);
    pcVar9 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                       ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&tgt);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_668,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1);
    cmCustomCommand::SetDepends(pcVar9,&local_668);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_668);
    pcVar9 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                       ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&tgt);
    cmCustomCommandLines::cmCustomCommandLines
              ((cmCustomCommandLines *)&file,(cmCustomCommandLines *)local_390);
    cmCustomCommand::SetCommandLines(pcVar9,(cmCustomCommandLines *)&file);
    cmCustomCommandLines::~cmCustomCommandLines((cmCustomCommandLines *)&file);
    pcVar9 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                       ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&tgt);
    cmCustomCommand::SetComment(pcVar9,"Checking Build System");
    pcVar9 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                       ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&tgt);
    cmCustomCommand::SetCMP0116Status(pcVar9,NEW);
    pcVar9 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                       ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&tgt);
    cmCustomCommand::SetEscapeOldStyle(pcVar9,false);
    pcVar9 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                       ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&tgt);
    cmCustomCommand::SetStdPipesUTF8(pcVar9,true);
    pcVar1 = local_60;
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::unique_ptr
              (&local_690,(unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&tgt
              );
    this_03 = cmLocalGenerator::AddCustomCommandToOutput((cmLocalGenerator *)pcVar1,&local_690,true)
    ;
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_690)
    ;
    this_00 = local_620;
    local_688 = this_03;
    if (this_03 == (cmSourceFile *)0x0) {
      std::operator+(&local_6b0,"Error adding rule for ",&this->StampFile);
      cmSystemTools::Error(&local_6b0);
      std::__cxx11::string::~string((string *)&local_6b0);
    }
    else {
      psVar4 = cmSourceFile::ResolveFullPath(this_03,(string *)0x0,(string *)0x0);
      cmGeneratorTarget::AddSource(this_00,psVar4,false);
    }
    uVar3 = (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x2c])();
    pcVar8 = local_5d8;
    if ((uVar3 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d0,"FOLDER",&local_6d1);
      cmGlobalGenerator::GetPredefinedTargetsFolder_abi_cxx11_
                (&local_6f8,&this->super_cmGlobalGenerator);
      cmTarget::SetProperty((cmTarget *)pcVar8,&local_6d0,&local_6f8);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::__cxx11::string::~string((string *)&local_6d0);
      std::allocator<char>::~allocator(&local_6d1);
    }
    std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
              (&local_610);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&tgt);
    std::__cxx11::string::~string((string *)local_4a8);
    std::__cxx11::string::~string((string *)local_428);
    cmCustomCommandLines::~cmCustomCommandLines((cmCustomCommandLines *)local_390);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range1);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmGlobalGhsMultiGenerator::AddCheckTarget()
{
  // Skip the target if no regeneration is to be done.
  if (this->GlobalSettingIsOn("CMAKE_SUPPRESS_REGENERATION")) {
    return false;
  }

  // Get the generators.
  std::vector<std::unique_ptr<cmLocalGenerator>> const& generators =
    this->LocalGenerators;
  auto& lg =
    cm::static_reference_cast<cmLocalGhsMultiGenerator>(generators[0]);

  // The name of the output file for the custom command.
  this->StampFile = lg.GetBinaryDirectory() + std::string("/CMakeFiles/") +
    CHECK_BUILD_SYSTEM_TARGET;

  // Add a custom rule to re-run CMake if any input files changed.
  {
    // Collect the input files used to generate all targets in this
    // project.
    std::vector<std::string> listFiles;
    for (const auto& gen : generators) {
      cm::append(listFiles, gen->GetMakefile()->GetListFiles());
    }

    // Add the cache file.
    listFiles.push_back(cmStrCat(
      this->GetCMakeInstance()->GetHomeOutputDirectory(), "/CMakeCache.txt"));

    // Print not implemented warning.
    if (this->GetCMakeInstance()->DoWriteGlobVerifyTarget()) {
      std::ostringstream msg;
      msg << "Any pre-check scripts, such as those generated for file(GLOB "
             "CONFIGURE_DEPENDS), will not be run by gbuild.";
      this->GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_WARNING,
                                             msg.str());
    }

    // Sort the list of input files and remove duplicates.
    std::sort(listFiles.begin(), listFiles.end(), std::less<std::string>());
    auto newEnd = std::unique(listFiles.begin(), listFiles.end());
    listFiles.erase(newEnd, listFiles.end());

    // Create a rule to re-run CMake and create output file.
    cmCustomCommandLines commandLines;
    commandLines.emplace_back(
      cmMakeCommandLine({ cmSystemTools::GetCMakeCommand(), "-E", "rm", "-f",
                          this->StampFile }));
    std::string argS = cmStrCat("-S", lg.GetSourceDirectory());
    std::string argB = cmStrCat("-B", lg.GetBinaryDirectory());
    commandLines.emplace_back(
      cmMakeCommandLine({ cmSystemTools::GetCMakeCommand(), argS, argB }));
    commandLines.emplace_back(cmMakeCommandLine(
      { cmSystemTools::GetCMakeCommand(), "-E", "touch", this->StampFile }));

    /* Create the target(Exclude from ALL_BUILD).
     *
     * The build tool, currently, does not support rereading the project files
     * if they get updated. So do not run this target as part of ALL_BUILD.
     */
    auto cc = cm::make_unique<cmCustomCommand>();
    cmTarget* tgt =
      lg.AddUtilityCommand(CHECK_BUILD_SYSTEM_TARGET, true, std::move(cc));
    auto ptr = cm::make_unique<cmGeneratorTarget>(tgt, &lg);
    auto* gt = ptr.get();
    lg.AddGeneratorTarget(std::move(ptr));

    // Add the rule.
    cc = cm::make_unique<cmCustomCommand>();
    cc->SetOutputs(this->StampFile);
    cc->SetDepends(listFiles);
    cc->SetCommandLines(commandLines);
    cc->SetComment("Checking Build System");
    cc->SetCMP0116Status(cmPolicies::NEW);
    cc->SetEscapeOldStyle(false);
    cc->SetStdPipesUTF8(true);

    if (cmSourceFile* file =
          lg.AddCustomCommandToOutput(std::move(cc), true)) {
      gt->AddSource(file->ResolveFullPath());
    } else {
      cmSystemTools::Error("Error adding rule for " + this->StampFile);
    }
    // Organize in the "predefined targets" folder:
    if (this->UseFolderProperty()) {
      tgt->SetProperty("FOLDER", this->GetPredefinedTargetsFolder());
    }
  }

  return true;
}